

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmFunctionDefinition
                    (ExpressionContext *ctx,VmModule *module,ExprFunctionDefinition *node)

{
  FunctionData *pFVar1;
  VmFunction *user;
  SynIdentifier *pSVar2;
  ExprBase *expression;
  int iVar3;
  VmConstant *el0;
  VmValue *pVVar4;
  VmBlock *pVVar5;
  VmInstruction *this;
  uint i;
  uint uVar6;
  VmValue *in_R9;
  IntrusiveList<ExprBase> *pIVar7;
  VmType type;
  VmValue *in_stack_ffffffffffffff90;
  VmBlock *block;
  VmFunction *local_58;
  VmBlock *pVStack_50;
  TraceScope traceScope;
  
  pFVar1 = node->function;
  user = pFVar1->vmFunction;
  if (module->skipFunctionDefinitions == true) {
    local_58 = (VmFunction *)(node->super_ExprBase).source;
    type = VmType::FunctionRef(&pFVar1->type->super_TypeBase);
    el0 = CreateConstantPointer
                    (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                     ctx->typeNullPtr,false);
    pVVar4 = anon_unknown.dwarf_f89de::CreateConstruct
                       (module,(SynBase *)local_58,type,&el0->super_VmValue,&user->super_VmValue,
                        (VmValue *)0x0,in_stack_ffffffffffffff90);
    anon_unknown.dwarf_f89de::CheckType(ctx,&node->super_ExprBase,pVVar4);
  }
  else {
    if (pFVar1->isPrototype == true) {
      pVVar4 = anon_unknown.dwarf_f89de::CreateVoid(module);
      return pVVar4;
    }
    if (CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)::token ==
        '\0') {
      iVar3 = __cxa_guard_acquire(&CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)
                                   ::token);
      if (iVar3 != 0) {
        CompileVmFunctionDefinition::token =
             NULLC::TraceGetToken("InstructionTreeVm","CompileVmFunctionDefinition");
        __cxa_guard_release(&CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)
                             ::token);
      }
    }
    NULLC::TraceScope::TraceScope(&traceScope,CompileVmFunctionDefinition::token);
    if ((user->function != (FunctionData *)0x0) &&
       (pSVar2 = user->function->name, pSVar2 != (SynIdentifier *)0x0)) {
      NULLC::TraceLabel((pSVar2->name).begin,(pSVar2->name).end);
    }
    module->skipFunctionDefinitions = true;
    local_58 = module->currentFunction;
    pVStack_50 = module->currentBlock;
    module->currentFunction = user;
    pVVar5 = anon_unknown.dwarf_f89de::CreateBlock(module,(node->super_ExprBase).source,"start");
    VmFunction::AddBlock(module->currentFunction,pVVar5);
    module->currentBlock = pVVar5;
    VmValue::AddUse(&pVVar5->super_VmValue,&user->super_VmValue);
    if (node->function->coroutine == true) {
      in_R9 = CompileVm(ctx,module,node->coroutineStateRead);
      this = anon_unknown.dwarf_f89de::CreateInstruction
                       ((anon_unknown_dwarf_f89de *)module,(VmModule *)(node->super_ExprBase).source
                        ,(SynBase *)0x0,(VmType)(ZEXT816(0x4c) << 0x40),(VmInstructionType)in_R9,
                        (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,&block->super_VmValue);
      pVVar5 = anon_unknown.dwarf_f89de::CreateBlock
                         (module,(node->super_ExprBase).source,"co_start");
      block = pVVar5;
      VmInstruction::AddArgument(this,&pVVar5->super_VmValue);
      VmFunction::AddBlock(module->currentFunction,pVVar5);
      module->currentBlock = pVVar5;
      SmallArray<VmBlock_*,_4U>::push_back(&user->restoreBlocks,&block);
      for (uVar6 = 0; uVar6 < node->function->yieldCount; uVar6 = uVar6 + 1) {
        block = anon_unknown.dwarf_f89de::CreateBlock
                          (module,(node->super_ExprBase).source,"restore");
        VmInstruction::AddArgument(this,&block->super_VmValue);
        SmallArray<VmBlock_*,_4U>::push_back(&user->restoreBlocks,&block);
      }
    }
    pIVar7 = &node->expressions;
    while (expression = pIVar7->head, expression != (ExprBase *)0x0) {
      CompileVm(ctx,module,expression);
      pIVar7 = (IntrusiveList<ExprBase> *)&expression->next;
    }
    anon_unknown.dwarf_f89de::CreateInstruction
              ((anon_unknown_dwarf_f89de *)module,(VmModule *)0x0,(SynBase *)0x0,
               (VmType)(ZEXT816(0x48) << 0x40),(VmInstructionType)in_R9);
    module->currentFunction = local_58;
    module->currentBlock = pVStack_50;
    module->skipFunctionDefinitions = false;
    pVVar4 = anon_unknown.dwarf_f89de::CreateVoid(module);
    NULLC::TraceScope::~TraceScope(&traceScope);
  }
  return pVVar4;
}

Assistant:

VmValue* CompileVmFunctionDefinition(ExpressionContext &ctx, VmModule *module, ExprFunctionDefinition *node)
{
	VmFunction *function = node->function->vmFunction;

	if(module->skipFunctionDefinitions)
		return CheckType(ctx, node, CreateConstruct(module, node->source, VmType::FunctionRef(node->function->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), function, NULL, NULL));

	if(node->function->isPrototype)
		return CreateVoid(module);

	TRACE_SCOPE("InstructionTreeVm", "CompileVmFunctionDefinition");

	if(function->function && function->function->name)
		TRACE_LABEL2(function->function->name->name.begin, function->function->name->name.end);

	module->skipFunctionDefinitions = true;

	// Store state
	VmFunction *currentFunction = module->currentFunction;
	VmBlock *currentBlock = module->currentBlock;

	// Switch to new function
	module->currentFunction = function;

	VmBlock *block = CreateBlock(module, node->source, "start");

	module->currentFunction->AddBlock(block);
	module->currentBlock = block;
	block->AddUse(function);

	if(node->function->coroutine)
	{
		VmValue *state = CompileVm(ctx, module, node->coroutineStateRead);

		VmInstruction *inst = CreateInstruction(module, node->source, VmType::Void, VM_INST_UNYIELD, state, NULL, NULL, NULL);

		{
			VmBlock *block = CreateBlock(module, node->source, "co_start");

			inst->AddArgument(block);

			module->currentFunction->AddBlock(block);
			module->currentBlock = block;

			function->restoreBlocks.push_back(block);
		}

		for(unsigned i = 0; i < node->function->yieldCount; i++)
		{
			VmBlock *block = CreateBlock(module, node->source, "restore");

			inst->AddArgument(block);

			function->restoreBlocks.push_back(block);
		}
	}

	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileVm(ctx, module, value);

	CreateAbortNoReturn(module, NULL);

	// Restore state
	module->currentFunction = currentFunction;
	module->currentBlock = currentBlock;

	module->skipFunctionDefinitions = false;

	return CreateVoid(module);
}